

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

int nghttp2_map_remove(nghttp2_map *map,nghttp2_map_key_type key)

{
  char cVar1;
  void *pvVar2;
  nghttp2_map_key_type nVar3;
  uint uVar4;
  nghttp2_map_bucket *pnVar5;
  uint uVar6;
  nghttp2_map_bucket *pnVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar7;
  
  cVar1 = (char)map->tablelenbits;
  uVar6 = (uint)(key * -0x61c88647) >> (-cVar1 & 0x1fU);
  pnVar8 = map->table;
  uVar10 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    if (pnVar8[uVar7].data == (void *)0x0) {
      return -0x1f5;
    }
    pnVar5 = pnVar8 + uVar7;
    uVar9 = map->tablelen;
    uVar4 = uVar9 - 1;
    if ((uVar6 - (pnVar5->hash >> (0x20U - cVar1 & 0x1f)) & uVar4) < uVar10) break;
    if (pnVar5->key == key) {
      uVar4 = uVar4 & uVar6 + 1;
      pnVar5->hash = 0;
      pnVar5->key = 0;
      pnVar5->data = (void *)0x0;
      while( true ) {
        uVar10 = (ulong)uVar4;
        if ((pnVar8[uVar10].data == (void *)0x0) ||
           (pnVar5 = pnVar8 + uVar10,
           (uVar4 - (pnVar5->hash >> (-(char)map->tablelenbits & 0x1fU)) & uVar9 - 1) == 0)) break;
        nVar3 = pnVar5->key;
        pvVar2 = pnVar5->data;
        pnVar8 = pnVar8 + uVar7;
        pnVar8->hash = pnVar5->hash;
        pnVar8->key = nVar3;
        pnVar8->data = pvVar2;
        pnVar5->hash = 0;
        pnVar5->key = 0;
        pnVar5->data = (void *)0x0;
        uVar9 = map->tablelen;
        uVar4 = uVar9 - 1 & uVar4 + 1;
        pnVar8 = map->table;
        uVar7 = uVar10;
      }
      map->size = map->size - 1;
      return 0;
    }
    uVar10 = uVar10 + 1;
    uVar6 = uVar6 + 1 & uVar4;
  }
  return -0x1f5;
}

Assistant:

int nghttp2_map_remove(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits), didx;
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (bkt->key == key) {
      map_bucket_set_data(bkt, 0, 0, NULL);

      didx = idx;
      idx = (idx + 1) & (map->tablelen - 1);

      for (;;) {
        bkt = &map->table[idx];
        if (bkt->data == NULL ||
            distance(map->tablelen, map->tablelenbits, bkt, idx) == 0) {
          break;
        }

        map->table[didx] = *bkt;
        map_bucket_set_data(bkt, 0, 0, NULL);
        didx = idx;

        idx = (idx + 1) & (map->tablelen - 1);
      }

      --map->size;

      return 0;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}